

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Routines_Disasm.c
# Opt level: O2

int Disasm(PDISASM pMyDisasm)

{
  int iVar1;
  
  InitVariables(pMyDisasm);
  AnalyzeOpcode(pMyDisasm);
  iVar1 = (pMyDisasm->Reserved_).ERROR_OPCODE;
  pMyDisasm->Error = iVar1;
  if ((pMyDisasm->Reserved_).OutOfBlock == 0) {
    if (iVar1 == -1) {
      BuildCompleteInstruction(pMyDisasm);
      iVar1 = -1;
    }
    else {
      FixOpSizeForMemoryOperand(pMyDisasm);
      FixREXPrefixes(pMyDisasm);
      FillSegmentsRegisters(pMyDisasm);
      CompleteInstructionFields(pMyDisasm);
      BuildCompleteInstruction(pMyDisasm);
      iVar1 = (int)(pMyDisasm->Reserved_).EIP_ - (int)pMyDisasm->EIP;
    }
  }
  else {
    pMyDisasm->Error = -2;
    iVar1 = -2;
  }
  return iVar1;
}

Assistant:

int __bea_callspec__ Disasm (PDISASM pMyDisasm)
{
  if (InitVariables(pMyDisasm)) {
    (void) AnalyzeOpcode(pMyDisasm);
    pMyDisasm->Error = GV.ERROR_OPCODE;
    if (!GV.OutOfBlock) {
      if (GV.ERROR_OPCODE == UNKNOWN_OPCODE) {
        #ifndef BEA_LIGHT_DISASSEMBLY
        BuildCompleteInstruction(pMyDisasm);
        #endif
        return UNKNOWN_OPCODE;
      }
      else {
        FixOpSizeForMemoryOperand(pMyDisasm);
        FixREXPrefixes(pMyDisasm);
        FillSegmentsRegisters(pMyDisasm);
        CompleteInstructionFields(pMyDisasm);
        #ifndef BEA_LIGHT_DISASSEMBLY
        BuildCompleteInstruction(pMyDisasm);
        #endif
        return (int) (GV.EIP_-pMyDisasm->EIP);
      }
    }
    else {
      pMyDisasm->Error = OUT_OF_BLOCK;
      return OUT_OF_BLOCK;
    }
  }
  else {
    return UNKNOWN_OPCODE;
  }
}